

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture1DArray_GL.cpp
# Opt level: O0

void __thiscall
Diligent::Texture1DArray_GL::Texture1DArray_GL
          (Texture1DArray_GL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          GLContextState *GLState,TextureDesc *TexDesc,TextureData *pInitData,bool bIsDeviceInternal
          )

{
  GLenum BindTarget;
  TextureDesc *this_00;
  uint *puVar1;
  Char *Message;
  GLTextureObj local_a4;
  undefined1 local_98 [8];
  string msg;
  undefined1 local_70 [8];
  Box DstBox;
  Uint32 Mip;
  Uint32 Slice;
  GLenum err;
  undefined1 local_39;
  TextureDesc *pTStack_38;
  bool bIsDeviceInternal_local;
  TextureDesc *TexDesc_local;
  GLContextState *GLState_local;
  RenderDeviceGLImpl *pDeviceGL_local;
  FixedBlockMemoryAllocator *TexViewObjAllocator_local;
  IReferenceCounters *pRefCounters_local;
  Texture1DArray_GL *this_local;
  
  local_39 = bIsDeviceInternal;
  pTStack_38 = TexDesc;
  TexDesc_local = (TextureDesc *)GLState;
  GLState_local = (GLContextState *)pDeviceGL;
  pDeviceGL_local = (RenderDeviceGLImpl *)TexViewObjAllocator;
  TexViewObjAllocator_local = (FixedBlockMemoryAllocator *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  TextureBaseGL::TextureBaseGL
            (&this->super_TextureBaseGL,pRefCounters,TexViewObjAllocator,pDeviceGL,TexDesc,0x8c18,
             pInitData,bIsDeviceInternal);
  (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture = (ITexture)&PTR_QueryInterface_00592c88;
  if (pTStack_38->Usage != USAGE_STAGING) {
    GLContextState::BindTexture
              ((GLContextState *)TexDesc_local,-1,(this->super_TextureBaseGL).m_BindTarget,
               &(this->super_TextureBaseGL).m_GlTexture);
    (*__glewTexStorage2D)
              ((this->super_TextureBaseGL).m_BindTarget,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.MipLevels,(this->super_TextureBaseGL).m_GLTexFormat,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.Width,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.field_3.ArraySize);
    Mip = glGetError();
    if (Mip != 0) {
      LogError<true,char[52],char[17],unsigned_int>
                (false,"Texture1DArray_GL",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1DArray_GL.cpp"
                 ,0x45,(char (*) [52])"Failed to allocate storage for the 1D texture array",
                 (char (*) [17])"\nGL Error Code: ",&Mip);
    }
    TextureBaseGL::SetDefaultGLParameters(&this->super_TextureBaseGL);
    if ((pInitData != (TextureData *)0x0) && (pInitData->pSubResources != (TextureSubResData *)0x0))
    {
      if ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
          super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
          .m_Desc.MipLevels *
          (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
          super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
          .m_Desc.field_3.ArraySize == pInitData->NumSubresources) {
        for (DstBox.MaxZ = 0;
            DstBox.MaxZ <
            (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
            super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
            .m_Desc.field_3.ArraySize; DstBox.MaxZ = DstBox.MaxZ + 1) {
          for (DstBox.MinZ = 0;
              DstBox.MinZ <
              (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
              super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
              .m_Desc.MipLevels; DstBox.MinZ = DstBox.MinZ + 1) {
            msg.field_2._12_4_ =
                 (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                 super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                 .m_Desc.Width >> ((byte)DstBox.MinZ & 0x1f);
            msg.field_2._8_4_ = 1;
            puVar1 = std::max<unsigned_int>
                               ((uint *)(msg.field_2._M_local_buf + 0xc),
                                (uint *)(msg.field_2._M_local_buf + 8));
            Box::Box((Box *)local_70,0,*puVar1,0,1);
            UpdateData(this,(GLContextState *)TexDesc_local,DstBox.MinZ,DstBox.MaxZ,(Box *)local_70,
                       pInitData->pSubResources +
                       (DstBox.MaxZ *
                        (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                        super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                        .m_Desc.MipLevels + DstBox.MinZ));
          }
        }
      }
      else {
        FormatString<char[33]>((string *)local_98,(char (*) [33])"Incorrect number of subresources")
        ;
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"Texture1DArray_GL",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture1DArray_GL.cpp"
                   ,99);
        std::__cxx11::string::~string((string *)local_98);
      }
    }
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::SetName
              (&(this->super_TextureBaseGL).m_GlTexture,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
    this_00 = TexDesc_local;
    BindTarget = (this->super_TextureBaseGL).m_BindTarget;
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::Null();
    GLContextState::BindTexture((GLContextState *)this_00,-1,BindTarget,&local_a4);
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::~GLObjWrapper
              (&local_a4);
  }
  return;
}

Assistant:

Texture1DArray_GL::Texture1DArray_GL(IReferenceCounters*        pRefCounters,
                                     FixedBlockMemoryAllocator& TexViewObjAllocator,
                                     RenderDeviceGLImpl*        pDeviceGL,
                                     GLContextState&            GLState,
                                     const TextureDesc&         TexDesc,
                                     const TextureData*         pInitData /*= nullptr*/,
                                     bool                       bIsDeviceInternal /*= false*/) :
    // clang-format off
    TextureBaseGL
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        TexDesc,
        GL_TEXTURE_1D_ARRAY,
        pInitData,
        bIsDeviceInternal
    }
// clang-format on
{
    if (TexDesc.Usage == USAGE_STAGING)
    {
        // We will use PBO initialized by TextureBaseGL
        return;
    }

    GLState.BindTexture(-1, m_BindTarget, m_GlTexture);

    //                             levels             format          width             height
    glTexStorage2D(m_BindTarget, m_Desc.MipLevels, m_GLTexFormat, m_Desc.Width, m_Desc.ArraySize);
    DEV_CHECK_GL_ERROR_AND_THROW("Failed to allocate storage for the 1D texture array");
    // When target is GL_TEXTURE_1D_ARRAY, calling glTexStorage2D() is equivalent to the following code:
    //for (i = 0; i < levels; i++)
    //{
    //    glTexImage2D(target, i, internalformat, width, height, 0, format, type, NULL);
    //    width = max(1, (width / 2));
    //}

    SetDefaultGLParameters();

    if (pInitData != nullptr && pInitData->pSubResources != nullptr)
    {
        if (m_Desc.MipLevels * m_Desc.ArraySize == pInitData->NumSubresources)
        {
            for (Uint32 Slice = 0; Slice < m_Desc.ArraySize; ++Slice)
            {
                for (Uint32 Mip = 0; Mip < m_Desc.MipLevels; ++Mip)
                {
                    Box DstBox{0, std::max(m_Desc.Width >> Mip, 1U),
                               0, 1};
                    // UpdateData() is a virtual function. If we try to call it through vtbl from here,
                    // we will get into TextureBaseGL::UpdateData(), because instance of Texture1DArray_GL
                    // is not fully constructed yet.
                    // To call the required function, we need to explicitly specify the class:
                    Texture1DArray_GL::UpdateData(GLState, Mip, Slice, DstBox, pInitData->pSubResources[Slice * m_Desc.MipLevels + Mip]);
                }
            }
        }
        else
        {
            UNEXPECTED("Incorrect number of subresources");
        }
    }

    m_GlTexture.SetName(m_Desc.Name);

    GLState.BindTexture(-1, m_BindTarget, GLObjectWrappers::GLTextureObj::Null());
}